

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  pointer pcVar1;
  Type *pTVar2;
  
  pTVar2 = value;
  if (value_arena == (Arena *)0x0 && my_arena != (Arena *)0x0) {
    Arena::Own<std::__cxx11::string>(my_arena,value);
  }
  else if (my_arena != value_arena) {
    if (my_arena == (Arena *)0x0) {
      pTVar2 = (Type *)operator_new(0x20);
      (pTVar2->_M_dataplus)._M_p = (pointer)&pTVar2->field_2;
      pTVar2->_M_string_length = 0;
      (pTVar2->field_2)._M_local_buf[0] = '\0';
    }
    else {
      pTVar2 = (Type *)Arena::AllocateAligned
                                 (my_arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      (pTVar2->_M_dataplus)._M_p = (pointer)&pTVar2->field_2;
      pTVar2->_M_string_length = 0;
      (pTVar2->field_2)._M_local_buf[0] = '\0';
      Arena::AddListNode(my_arena,pTVar2,arena_destruct_object<std::__cxx11::string>);
    }
    std::__cxx11::string::_M_assign((string *)pTVar2);
    if (value_arena == (Arena *)0x0) {
      pcVar1 = (value->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &value->field_2) {
        operator_delete(pcVar1,(value->field_2)._M_allocated_capacity + 1);
      }
      operator_delete(value,0x20);
    }
  }
  UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (this,pTVar2);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != NULL && value_arena == NULL) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}